

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

TableOfContentsNode * __thiscall
soul::SourceCodeModel::createTableOfContentsRoot
          (TableOfContentsNode *__return_storage_ptr__,SourceCodeModel *this)

{
  ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pointer pbVar1;
  uint64_t uVar2;
  bool bVar3;
  TableOfContentsNode *pTVar4;
  size_t sVar5;
  Section *startElement;
  Section *pSVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_00;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_01;
  bool local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  TableOfContentsNode *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  byte local_1e1;
  string local_1e0;
  undefined1 local_1c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  undefined1 local_188 [8];
  TokenisedPathString path;
  Module *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filePath;
  File *f;
  const_iterator __end1;
  const_iterator __begin1;
  vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_> *__range1;
  SourceCodeModel *this_local;
  TableOfContentsNode *root;
  
  TableOfContentsNode::TableOfContentsNode(__return_storage_ptr__);
  __end1 = std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>::
           begin(&this->files);
  f = (File *)std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>
              ::end(&this->files);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_soul::SourceCodeModel::File_*,_std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>_>
                                     *)&f), bVar3) {
    filePath.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_soul::SourceCodeModel::File_*,_std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>_>
                  ::operator*(&__end1);
    local_90 = &local_88;
    std::__cxx11::string::string
              ((string *)local_90,
               (string *)
               &((reference)
                filePath.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->title);
    local_68 = &local_88;
    local_60 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(local_9d);
    __l._M_len = local_60;
    __l._M_array = local_68;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,__l,local_9d);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(local_9d);
    pbVar8 = &local_88;
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68;
    do {
      local_288 = local_288 + -1;
      std::__cxx11::string::~string((string *)local_288);
      pbVar1 = filePath.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (local_288 != pbVar8);
    ArrayView<std::__cxx11::string>::
    ArrayView<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((ArrayView<std::__cxx11::string> *)&__range2,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
    path_00.e = pbVar8;
    path_00.s = local_a8;
    pTVar4 = findOrCreateNode((soul *)__return_storage_ptr__,(TableOfContentsNode *)__range2,path_00
                             );
    pTVar4->file = (File *)pbVar1;
    pbVar1 = filePath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 6;
    __end2 = std::
             vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>::
             begin((vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>
                    *)&pbVar1->_M_string_length);
    m = (Module *)
        std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>::
        end((vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_> *
            )&pbVar1->_M_string_length);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_soul::SourceCodeModel::Module_*,_std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>_>
                                       *)&m), bVar3) {
      path.sections.space[0xf] =
           (uint64_t)
           __gnu_cxx::
           __normal_iterator<const_soul::SourceCodeModel::Module_*,_std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string
                ((string *)
                 &modulePath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (string *)&((reference)path.sections.space[0xf])->fullyQualifiedName);
      TokenisedPathString::TokenisedPathString
                ((TokenisedPathString *)local_188,
                 (string *)
                 &modulePath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &modulePath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
      sVar5 = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::size
                        ((ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *)
                         ((long)&path.fullPath.field_2 + 8));
      local_1e1 = 0;
      local_2a9 = false;
      if (1 < sVar5) {
        TokenisedPathString::getSection_abi_cxx11_(&local_1e0,(TokenisedPathString *)local_188,0);
        local_1e1 = 1;
        local_2a9 = std::operator==(&local_1e0,"soul");
      }
      if ((local_1e1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      if (local_2a9 != false) {
        TokenisedPathString::getSection_abi_cxx11_((string *)&i,(TokenisedPathString *)local_188,1);
        std::operator+(&local_208,"soul::",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c0,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&i);
        this_00 = (ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *)
                  (&path.fullPath.field_2._M_allocated_capacity + 1);
        startElement = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::begin
                                 (this_00);
        pSVar6 = ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::begin(this_00);
        ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::erase
                  (this_00,startElement,pSVar6 + 2);
      }
      for (local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          pbVar8 = local_230,
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::size
                             ((ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *)
                              ((long)&path.fullPath.field_2 + 8)), uVar2 = path.sections.space[0xf],
          pbVar8 < pbVar7;
          local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_230->field_0x1) {
        TokenisedPathString::getSection_abi_cxx11_
                  (&local_250,(TokenisedPathString *)local_188,(size_t)local_230);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c0,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
      }
      ArrayView<std::__cxx11::string>::
      ArrayView<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((ArrayView<std::__cxx11::string> *)&local_260,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c0);
      path_01.e = pbVar7;
      path_01.s = local_258;
      pTVar4 = findOrCreateNode((soul *)__return_storage_ptr__,local_260,path_01);
      pTVar4->module = (Module *)uVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c0);
      TokenisedPathString::~TokenisedPathString((TokenisedPathString *)local_188);
      __gnu_cxx::
      __normal_iterator<const_soul::SourceCodeModel::Module_*,_std::vector<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    __gnu_cxx::
    __normal_iterator<const_soul::SourceCodeModel::File_*,_std::vector<soul::SourceCodeModel::File,_std::allocator<soul::SourceCodeModel::File>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

SourceCodeModel::TableOfContentsNode SourceCodeModel::createTableOfContentsRoot() const
{
    TableOfContentsNode root;

    for (auto& f : files)
    {
        std::vector<std::string> filePath { f.title };
        findOrCreateNode (root, filePath).file = std::addressof (f);

        for (auto& m : f.modules)
        {
            TokenisedPathString path (m.fullyQualifiedName);
            auto modulePath = filePath;

            if (path.sections.size() > 1 && path.getSection(0) == "soul")
            {
                modulePath.push_back ("soul::" + path.getSection (1));
                path.sections.erase (path.sections.begin(), path.sections.begin() + 2);
            }

            for (size_t i = 0; i < path.sections.size(); ++i)
                modulePath.push_back (path.getSection (i));

            findOrCreateNode (root, modulePath).module = std::addressof (m);
        }
    }

    return root;
}